

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_Check1_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Check1_Test *this)

{
  initializer_list<TestFundElementsUtxoVector> __l;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  reference pvVar5;
  string *psVar6;
  char *pcVar7;
  size_type sVar8;
  char *pcVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar11;
  AssertionResult gtest_ar_7;
  CfdException *except;
  AssertionResult gtest_ar_6;
  ConfidentialTxInReference *txin;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range1_1;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  ConfidentialTransactionContext context;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  double fee_rate;
  ElementsUtxoAndOption txin_utxo;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_utxos;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr1;
  ElementsConfidentialAddress ct_addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Address addr3;
  Address addr2;
  Address addr1;
  Address addr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  ExtPubkey key;
  Txid txid;
  TestFundElementsUtxoVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *__range1;
  uint32_t i;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext tx;
  ElementsAddressFactory factory;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
  *in_stack_ffffffffffffd758;
  AbstractTxInReference *this_00;
  ExtPubkey *in_stack_ffffffffffffd760;
  ElementsUtxoAndOption *this_01;
  undefined4 in_stack_ffffffffffffd768;
  undefined4 uVar12;
  undefined4 in_stack_ffffffffffffd76c;
  ElementsUtxoAndOption *in_stack_ffffffffffffd770;
  CoinSelectionOption *this_02;
  size_type in_stack_ffffffffffffd778;
  vector *lhs_expression;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd780;
  allocator_type *in_stack_ffffffffffffd788;
  undefined4 in_stack_ffffffffffffd790;
  undefined4 in_stack_ffffffffffffd794;
  iterator in_stack_ffffffffffffd798;
  size_type in_stack_ffffffffffffd7a0;
  string *local_2690;
  AssertHelper local_2418;
  Message local_2410;
  undefined4 local_2408;
  undefined4 local_2404;
  AssertionResult local_2400;
  SigHashType local_23f0 [15];
  allocator local_23e1;
  string local_23e0 [32];
  string local_23c0 [39];
  allocator local_2399;
  string local_2398 [32];
  Pubkey local_2378;
  Txid local_2360;
  OutPoint local_2340;
  reference local_2318;
  ConfidentialTxInReference *local_2310;
  __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_2308;
  undefined1 local_2300 [24];
  undefined1 *local_22e8;
  undefined1 local_22e0 [24];
  string local_22c8 [32];
  ConfidentialTransactionContext local_22a8 [184];
  AssertHelper local_21f0;
  Message local_21e8;
  string local_21e0 [32];
  AssertionResult local_21c0;
  AssertHelper local_21b0;
  Message local_21a8;
  string local_21a0 [32];
  AssertionResult local_2180;
  AssertHelper local_2170;
  Message local_2168;
  string local_2160 [32];
  AssertionResult local_2140;
  AssertHelper local_2130;
  Message local_2128;
  size_type local_2120;
  undefined8 local_2118;
  AssertionResult local_2110;
  AssertHelper local_2100;
  Message local_20f8;
  undefined8 local_20f0;
  undefined4 local_20e4;
  AssertionResult local_20e0;
  AssertHelper local_20d0;
  Message local_20c8;
  string local_20c0 [32];
  AssertionResult local_20a0;
  map local_2090 [32];
  string local_2070 [87];
  ElementsTransactionApi local_2019;
  ConfidentialAssetId local_2018 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1fb0;
  vector local_1f94 [4];
  Amount local_1f90 [16];
  double local_1f80;
  undefined8 local_1f78;
  undefined1 local_1f70;
  allocator local_1f61;
  string local_1f60 [32];
  Txid local_1f40 [2];
  Txid local_1ef8 [16];
  string local_1ce8 [32];
  undefined8 local_1cc8;
  undefined1 local_1cc0;
  undefined4 local_1cb8;
  ConfidentialAssetId local_1ca8 [17];
  ConfidentialAssetId local_19e8;
  undefined1 local_19b8 [112];
  Pubkey local_1948;
  ElementsConfidentialAddress local_1930 [432];
  undefined1 local_1780 [112];
  Pubkey local_1710;
  ElementsConfidentialAddress local_16f8 [432];
  undefined1 local_1548 [112];
  Pubkey local_14d8;
  ElementsConfidentialAddress local_14c0 [432];
  undefined1 local_1310 [112];
  Pubkey local_12a0;
  ElementsConfidentialAddress local_1288 [432];
  _Base_ptr local_10d8;
  undefined1 local_10d0;
  string local_10c8 [32];
  string local_10a8 [32];
  _Base_ptr local_1088;
  undefined1 local_1080;
  string local_1078 [32];
  string local_1058 [32];
  _Base_ptr local_1038;
  undefined1 local_1030;
  string local_1028 [32];
  string local_1008 [32];
  undefined1 local_fe8 [56];
  string local_fb0 [32];
  string local_f90 [383];
  allocator local_e11;
  string local_e10 [32];
  string local_df0 [383];
  allocator local_c71;
  string local_c70 [32];
  string local_c50 [383];
  allocator local_ad1;
  string local_ad0 [32];
  string local_ab0 [376];
  _Base_ptr local_938;
  undefined1 local_930;
  Amount local_928 [16];
  string local_918 [32];
  _Base_ptr local_8f8;
  undefined1 local_8f0;
  Amount local_8e8 [16];
  string local_8d8 [32];
  _Base_ptr local_8b8;
  undefined1 local_8b0;
  Amount local_8a8 [16];
  string local_898 [32];
  map local_878 [48];
  undefined1 local_848 [48];
  string local_818 [32];
  ExtPubkey local_7f8;
  ConfidentialAssetId local_788;
  Amount local_760 [8];
  value_type local_758;
  Txid local_750;
  Txid local_730;
  Txid local_710;
  reference local_6f0;
  TestFundElementsUtxoVector *local_6e8;
  __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
  local_6e0;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *local_6d8;
  uint local_6cc;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_6c8;
  allocator local_6a9;
  string local_6a8 [32];
  ConfidentialTransactionContext local_688 [184];
  ElementsAddressFactory local_5d0 [42];
  allocator local_5a6 [2];
  undefined1 local_5a4;
  undefined1 local_5a3;
  undefined1 local_5a2;
  allocator local_5a1;
  allocator local_5a0;
  undefined1 local_59f;
  undefined1 local_59e;
  allocator local_59d;
  allocator local_59c;
  undefined1 local_59b;
  undefined1 local_59a;
  allocator local_599;
  allocator local_598;
  undefined1 local_597;
  undefined1 local_596;
  allocator local_595;
  allocator local_594;
  undefined1 local_593;
  undefined1 local_592;
  allocator local_591;
  allocator local_590;
  undefined1 local_58f;
  undefined1 local_58e;
  allocator local_58d;
  allocator local_58c;
  undefined1 local_58b;
  undefined1 local_58a;
  allocator local_589;
  allocator local_588;
  undefined1 local_587;
  undefined1 local_586;
  allocator local_585;
  allocator local_584;
  undefined1 local_583;
  undefined1 local_582;
  allocator local_581;
  allocator local_580;
  undefined1 local_57f;
  undefined1 local_57e;
  allocator local_57d;
  allocator local_57c;
  undefined1 local_57b;
  undefined1 local_57a;
  allocator local_579;
  allocator local_578;
  undefined1 local_577;
  undefined1 local_576;
  allocator local_575 [20];
  allocator local_561;
  string *local_560;
  string local_558 [32];
  undefined4 local_538;
  undefined8 local_530;
  string local_508 [32];
  string local_4e8 [32];
  undefined4 local_4c8;
  undefined8 local_4c0;
  string asStack_498 [32];
  string local_478 [32];
  undefined4 local_458;
  undefined8 local_450;
  string asStack_428 [32];
  string local_408 [32];
  undefined4 local_3e8;
  undefined8 local_3e0;
  string asStack_3b8 [32];
  string local_398 [32];
  undefined4 local_378;
  undefined8 local_370;
  string asStack_348 [32];
  string local_328 [32];
  undefined4 local_308;
  undefined8 local_300;
  string asStack_2d8 [32];
  string local_2b8 [32];
  undefined4 local_298;
  undefined8 local_290;
  string asStack_268 [32];
  string local_248 [32];
  undefined4 local_228;
  undefined8 local_220;
  string asStack_1f8 [32];
  string local_1d8 [32];
  undefined4 local_1b8;
  undefined8 local_1b0;
  string asStack_188 [32];
  string local_168 [32];
  undefined4 local_148;
  undefined8 local_140;
  string asStack_118 [32];
  string local_f8 [32];
  undefined4 local_d8;
  undefined8 local_d0;
  string asStack_a8 [32];
  string local_88 [32];
  undefined4 local_68;
  undefined8 local_60;
  string asStack_38 [32];
  string *local_18;
  undefined8 local_10;
  
  if ((TestBody()::kFundCoinSelectElementsTestVector3 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3), iVar2 != 0)) {
    local_5a4 = 1;
    local_560 = local_558;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_558,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
               &local_561);
    local_577 = 1;
    local_538 = 0;
    local_530 = 0x12a05f20;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_576 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_508,
               "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
               local_575);
    local_576 = 0;
    local_577 = 0;
    local_560 = local_4e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4e8,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
               &local_578);
    local_57b = 1;
    local_4c8 = 0;
    local_4c0 = 0x4a817c8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_57a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_498,
               "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
               &local_579);
    local_57a = 0;
    local_57b = 0;
    local_560 = local_478;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_478,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
               &local_57c);
    local_57f = 1;
    local_458 = 0;
    local_450 = 1250000000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_57e = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_428,
               "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
               &local_57d);
    local_57e = 0;
    local_57f = 0;
    local_560 = local_408;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_408,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
               &local_580);
    local_583 = 1;
    local_3e8 = 0;
    local_3e0 = 0x2540be4;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_582 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_3b8,
               "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
               &local_581);
    local_582 = 0;
    local_583 = 0;
    local_560 = local_398;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_398,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
               &local_584);
    local_587 = 1;
    local_378 = 0;
    local_370 = 0x9502f90;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_586 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_348,
               "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
               &local_585);
    local_586 = 0;
    local_587 = 0;
    local_560 = local_328;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_328,"b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
               &local_588);
    local_58b = 1;
    local_308 = 0;
    local_300 = 2500000000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_58a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_2d8,
               "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
               &local_589);
    local_58a = 0;
    local_58b = 0;
    local_560 = local_2b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2b8,"0000000000000000000000000000000000000000000000000000000000000b01",
               &local_58c);
    local_58f = 1;
    local_298 = 0;
    local_290 = 0x19abe00;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_58e = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_268,
               "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
               &local_58d);
    local_58e = 0;
    local_58f = 0;
    local_560 = local_248;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_248,"0000000000000000000000000000000000000000000000000000000000000b02",
               &local_590);
    local_593 = 1;
    local_228 = 0;
    local_220 = 750000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_592 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_1f8,
               "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
               &local_591);
    local_592 = 0;
    local_593 = 0;
    local_560 = local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1d8,"0000000000000000000000000000000000000000000000000000000000000b03",
               &local_594);
    local_597 = 1;
    local_1b8 = 0;
    local_1b0 = 0x14a61a62;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_596 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_188,
               "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
               &local_595);
    local_596 = 0;
    local_597 = 0;
    local_560 = local_168;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_168,"0000000000000000000000000000000000000000000000000000000000000b04",
               &local_598);
    local_59b = 1;
    local_148 = 0;
    local_140 = 0x119ed3e;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_59a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_118,
               "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
               &local_599);
    local_59a = 0;
    local_59b = 0;
    local_560 = local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f8,"0000000000000000000000000000000000000000000000000000000000000c01",
               &local_59c);
    local_59f = 1;
    local_d8 = 0;
    local_d0 = 0x23e8eb8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_59e = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_a8,
               "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
               &local_59d);
    local_59e = 0;
    local_59f = 0;
    local_560 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"0000000000000000000000000000000000000000000000000000000000000c02",
               &local_5a0);
    local_5a3 = 1;
    local_68 = 0;
    local_60 = 0x79252f0;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    local_5a2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_38,
               "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
               &local_5a1);
    local_5a2 = 0;
    local_5a3 = 0;
    local_5a4 = 0;
    local_18 = local_558;
    local_10 = 0xc;
    std::allocator<TestFundElementsUtxoVector>::allocator
              ((allocator<TestFundElementsUtxoVector> *)0x29abb0);
    __l._M_len = in_stack_ffffffffffffd7a0;
    __l._M_array = in_stack_ffffffffffffd798;
    std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::vector
              ((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *)
               CONCAT44(in_stack_ffffffffffffd794,in_stack_ffffffffffffd790),__l,
               in_stack_ffffffffffffd788);
    std::allocator<TestFundElementsUtxoVector>::~allocator
              ((allocator<TestFundElementsUtxoVector> *)0x29abe3);
    local_2690 = (string *)&local_18;
    do {
      local_2690 = local_2690 + -0x70;
      TestFundElementsUtxoVector::~TestFundElementsUtxoVector
                ((TestFundElementsUtxoVector *)in_stack_ffffffffffffd760);
    } while (local_2690 != local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_59d);
    std::allocator<char>::~allocator((allocator<char> *)&local_59c);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    std::allocator<char>::~allocator((allocator<char> *)&local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_595);
    std::allocator<char>::~allocator((allocator<char> *)&local_594);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
    std::allocator<char>::~allocator((allocator<char> *)&local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_58d);
    std::allocator<char>::~allocator((allocator<char> *)&local_58c);
    std::allocator<char>::~allocator((allocator<char> *)&local_589);
    std::allocator<char>::~allocator((allocator<char> *)&local_588);
    std::allocator<char>::~allocator((allocator<char> *)&local_585);
    std::allocator<char>::~allocator((allocator<char> *)&local_584);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    std::allocator<char>::~allocator((allocator<char> *)&local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_57d);
    std::allocator<char>::~allocator((allocator<char> *)&local_57c);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::allocator<char>::~allocator((allocator<char> *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)local_575);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    __cxa_atexit(std::
                 vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
                 ~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
    __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
  }
  if ((TestBody()::kExpTxData_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::kExpTxData_abi_cxx11_,
               "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
               ,local_5a6);
    std::allocator<char>::~allocator((allocator<char> *)local_5a6);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
  }
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory(local_5d0,kLiquidV1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6a8,
             "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
             ,&local_6a9);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_688,local_6a8);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x29aea4);
  std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::size
            (&TestBody::kFundCoinSelectElementsTestVector3);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (in_stack_ffffffffffffd780,in_stack_ffffffffffffd778);
  local_6cc = 0;
  local_6d8 = &TestBody::kFundCoinSelectElementsTestVector3;
  local_6e0._M_current =
       (TestFundElementsUtxoVector *)
       std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::begin
                 (in_stack_ffffffffffffd758);
  local_6e8 = (TestFundElementsUtxoVector *)
              std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
              end(in_stack_ffffffffffffd758);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffd760,
                            (__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffd758), bVar1) {
    local_6f0 = __gnu_cxx::
                __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                ::operator*(&local_6e0);
    cfd::core::Txid::Txid(&local_710);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cfd::core::Txid::Txid(&local_730,(string *)local_6f0);
      cfd::core::Txid::operator=(&local_710,&local_730);
      cfd::core::Txid::~Txid((Txid *)0x29af96);
    }
    cfd::core::Txid::Txid(&local_750,(string *)local_6f0);
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6c8,(ulong)local_6cc);
    cfd::core::Txid::operator=((Txid *)(pvVar5 + 0x28),&local_750);
    cfd::core::Txid::~Txid((Txid *)0x29b8e8);
    uVar3 = local_6f0->vout;
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6c8,(ulong)local_6cc);
    *(uint32_t *)(pvVar5 + 0x48) = uVar3;
    cfd::core::Amount::Amount(local_760,local_6f0->amount);
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6c8,(ulong)local_6cc);
    pvVar5[0x260] = local_758;
    *(Amount (*) [8])(pvVar5 + 600) = local_760;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_788,(string *)&local_6f0->asset);
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6c8,(ulong)local_6cc);
    cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(pvVar5 + 0x278),&local_788);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x29b9be);
    psVar6 = &local_6f0->descriptor;
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6c8,(ulong)local_6cc);
    std::__cxx11::string::operator=((string *)(pvVar5 + 0x238),(string *)psVar6);
    pvVar5 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6c8,(ulong)local_6cc);
    *(undefined4 *)(pvVar5 + 0x268) = 6;
    local_6cc = local_6cc + 1;
    cfd::core::Txid::~Txid((Txid *)0x29ba3f);
    __gnu_cxx::
    __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
    ::operator++(&local_6e0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_818,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,(allocator *)(local_848 + 0x2f));
  cfd::core::ExtPubkey::ExtPubkey(&local_7f8,local_818);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)(local_848 + 0x2f));
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_848,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x29bb2e);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount(local_8a8,0x6e6f7c0);
  pVar10 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffd770,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768),
                      (Amount *)in_stack_ffffffffffffd760);
  local_8b8 = (_Base_ptr)pVar10.first._M_node;
  local_8b0 = pVar10.second;
  std::__cxx11::string::~string(local_898);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount(local_8e8,0x14b18c08);
  pVar10 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffd770,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768),
                      (Amount *)in_stack_ffffffffffffd760);
  local_8f8 = (_Base_ptr)pVar10.first._M_node;
  local_8f0 = pVar10.second;
  std::__cxx11::string::~string(local_8d8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Amount::Amount(local_928,0x23e8e54);
  pVar10 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffd770,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768),
                      (Amount *)in_stack_ffffffffffffd760);
  local_938 = (_Base_ptr)pVar10.first._M_node;
  local_930 = pVar10.second;
  std::__cxx11::string::~string(local_918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ad0,"ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h",&local_ad1);
  cfd::AddressFactory::GetAddress(local_ab0);
  std::__cxx11::string::~string(local_ad0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ad1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c70,"ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e",&local_c71);
  cfd::AddressFactory::GetAddress(local_c50);
  std::__cxx11::string::~string(local_c70);
  std::allocator<char>::~allocator((allocator<char> *)&local_c71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e10,"ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn",&local_e11);
  cfd::AddressFactory::GetAddress(local_df0);
  std::__cxx11::string::~string(local_e10);
  std::allocator<char>::~allocator((allocator<char> *)&local_e11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fb0,"ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m",(allocator *)(local_fe8 + 0x37))
  ;
  cfd::AddressFactory::GetAddress(local_f90);
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)(local_fe8 + 0x37));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x29be74);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pVar11 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffd770,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffd760);
  local_1038 = (_Base_ptr)pVar11.first._M_node;
  local_1030 = pVar11.second;
  std::__cxx11::string::~string(local_1028);
  std::__cxx11::string::~string(local_1008);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pVar11 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffd770,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffd760);
  local_1088 = (_Base_ptr)pVar11.first._M_node;
  local_1080 = pVar11.second;
  std::__cxx11::string::~string(local_1078);
  std::__cxx11::string::~string(local_1058);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  cfd::core::Address::GetAddress_abi_cxx11_();
  pVar11 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffd770,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_ffffffffffffd760);
  local_10d8 = (_Base_ptr)pVar11.first._M_node;
  local_10d0 = pVar11.second;
  std::__cxx11::string::~string(local_10c8);
  std::__cxx11::string::~string(local_10a8);
  cfd::core::ExtPubkey::DerivePubkey((uint)local_1310);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (local_1288,(Address *)local_ab0,&local_12a0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x29c08c);
  cfd::core::ExtPubkey::~ExtPubkey(in_stack_ffffffffffffd760);
  cfd::core::ExtPubkey::DerivePubkey((uint)local_1548);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (local_14c0,(Address *)local_c50,&local_14d8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x29c0f8);
  cfd::core::ExtPubkey::~ExtPubkey(in_stack_ffffffffffffd760);
  cfd::core::ExtPubkey::DerivePubkey((uint)local_1780);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (local_16f8,(Address *)local_df0,&local_1710);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x29c164);
  cfd::core::ExtPubkey::~ExtPubkey(in_stack_ffffffffffffd760);
  cfd::core::ExtPubkey::DerivePubkey((uint)local_19b8);
  cfd::core::ExtPubkey::GetPubkey();
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (local_1930,(Address *)local_f90,&local_1948);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x29c1d0);
  cfd::core::ExtPubkey::~ExtPubkey(in_stack_ffffffffffffd760);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x29c1ea);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x29c1f7);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffd770);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1f60,"9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff",
             &local_1f61);
  cfd::core::Txid::Txid(local_1f40,local_1f60);
  cfd::core::Txid::operator=(local_1ef8,local_1f40);
  cfd::core::Txid::~Txid((Txid *)0x29c274);
  std::__cxx11::string::~string(local_1f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f61);
  cfd::core::Amount::Amount((Amount *)&local_1f78,0x6b22c20);
  local_1cc0 = local_1f70;
  local_1cc8 = local_1f78;
  cfd::core::ConfidentialAssetId::operator=(local_1ca8,&exp_dummy_asset_a);
  std::__cxx11::string::operator=
            (local_1ce8,
             "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
            );
  local_1cb8 = 6;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
             *)in_stack_ffffffffffffd770,
            (value_type *)CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768));
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd770,
             (value_type *)CONCAT44(in_stack_ffffffffffffd76c,in_stack_ffffffffffffd768));
  local_1f80 = 0.15;
  cfd::core::Amount::Amount(local_1f90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x29c353);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)local_2018);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(local_1f80);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(0.15);
  cfd::CoinSelectionOption::SetFeeAsset(local_2018);
  cfd::CoinSelectionOption::SetBlindInfo((int)local_2018,0);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_2019);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  lhs_expression = local_1f94;
  this_02 = (CoinSelectionOption *)local_1f90;
  this_01 = (ElementsUtxoAndOption *)local_848;
  this_00 = (AbstractTxInReference *)local_fe8;
  uVar12 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (local_2070,(vector *)&local_2019,local_2090,(vector *)&local_6c8,local_878,&local_19e8,
             SUB81(this_00,0),local_1f80,(Amount *)this_01,
             (UtxoFilter *)CONCAT44(in_stack_ffffffffffffd76c,1),this_02,lhs_expression,
             (NetType)local_2018,(vector *)&local_1fb0,
             (Amount *)CONCAT44(in_stack_ffffffffffffd794,3));
  std::__cxx11::string::~string((string *)local_2090);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)lhs_expression,(char *)this_02,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffd76c,uVar12),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string(local_20c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20a0);
  if (!bVar1) {
    testing::Message::Message(&local_20c8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x29cb09);
    testing::internal::AssertHelper::AssertHelper
              (&local_20d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x618,pcVar7);
    testing::internal::AssertHelper::operator=(&local_20d0,&local_20c8);
    testing::internal::AssertHelper::~AssertHelper(&local_20d0);
    testing::Message::~Message((Message *)0x29cb6c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29cbc4);
  local_20e4 = 0x26a;
  local_20f0 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)lhs_expression,(char *)this_02,
             (int *)CONCAT44(in_stack_ffffffffffffd76c,uVar12),(long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20e0);
  if (!bVar1) {
    testing::Message::Message(&local_20f8);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x29cc92);
    testing::internal::AssertHelper::AssertHelper
              (&local_2100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x619,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2100,&local_20f8);
    testing::internal::AssertHelper::~AssertHelper(&local_2100);
    testing::Message::~Message((Message *)0x29ccf5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29cd4d);
  local_2118 = 3;
  local_2120 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_1fb0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((char *)lhs_expression,(char *)this_02,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffd76c,uVar12),(unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2110);
  if (!bVar1) {
    testing::Message::Message(&local_2128);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x29ce0a);
    testing::internal::AssertHelper::AssertHelper
              (&local_2130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x61a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2130,&local_2128);
    testing::internal::AssertHelper::~AssertHelper(&local_2130);
    testing::Message::~Message((Message *)0x29ce6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x29cec5);
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_1fb0);
  if (sVar8 == 3) {
    cfd::core::Address::GetAddress_abi_cxx11_();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_1fb0,2);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2140,"addr1.GetAddress().c_str()",
               "append_txout_addresses[2].c_str()",pcVar7,pcVar9);
    std::__cxx11::string::~string(local_2160);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2140);
    if (!bVar1) {
      testing::Message::Message(&local_2168);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x29cfec);
      testing::internal::AssertHelper::AssertHelper
                (&local_2170,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61d,pcVar7);
      testing::internal::AssertHelper::operator=(&local_2170,&local_2168);
      testing::internal::AssertHelper::~AssertHelper(&local_2170);
      testing::Message::~Message((Message *)0x29d04f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x29d0a7);
    cfd::core::Address::GetAddress_abi_cxx11_();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_1fb0,0);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2180,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",pcVar7,pcVar9);
    std::__cxx11::string::~string(local_21a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2180);
    if (!bVar1) {
      testing::Message::Message(&local_21a8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x29d1b6);
      testing::internal::AssertHelper::AssertHelper
                (&local_21b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61e,pcVar7);
      testing::internal::AssertHelper::operator=(&local_21b0,&local_21a8);
      testing::internal::AssertHelper::~AssertHelper(&local_21b0);
      testing::Message::~Message((Message *)0x29d219);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x29d271);
    cfd::core::Address::GetAddress_abi_cxx11_();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_1fb0,1);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_21c0,"addr3.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",pcVar7,pcVar9);
    std::__cxx11::string::~string(local_21e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_21c0);
    if (!bVar1) {
      testing::Message::Message(&local_21e8);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x29d381);
      testing::internal::AssertHelper::AssertHelper
                (&local_21f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61f,pcVar7);
      testing::internal::AssertHelper::operator=(&local_21f0,&local_21e8);
      testing::internal::AssertHelper::~AssertHelper(&local_21f0);
      testing::Message::~Message((Message *)0x29d3e4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x29d439);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_22a8,local_22c8);
  std::__cxx11::string::~string(local_22c8);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x29d49d);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd76c,uVar12));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd76c,uVar12));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd76c,uVar12));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd76c,uVar12));
  cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_22a8);
  cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_22a8);
  cfd::ConfidentialTransactionContext::Blind
            ((vector *)local_22a8,(long)local_22e0,1,0,(vector *)0x24);
  cfd::core::ConfidentialTransaction::GetTxInList();
  local_22e8 = local_2300;
  local_2308._M_current =
       (ConfidentialTxInReference *)
       std::
       vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ::begin((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                *)this_00);
  local_2310 = (ConfidentialTxInReference *)
               std::
               vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ::end((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                      *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_01,
                            (__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_00), bVar1) {
    local_2318 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                 ::operator*(&local_2308);
    cfd::core::AbstractTxInReference::GetTxid(this_00);
    uVar3 = cfd::core::AbstractTxInReference::GetVout(&local_2318->super_AbstractTxInReference);
    cfd::core::OutPoint::OutPoint(&local_2340,&local_2360,uVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2398,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
               &local_2399);
    cfd::core::Pubkey::Pubkey(&local_2378,local_2398);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_23e0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_23e1);
    cfd::core::Privkey::FromWif(local_23c0,(NetType)local_23e0,true);
    cfd::core::SigHashType::SigHashType(local_23f0);
    cfd::ConfidentialTransactionContext::SignWithKey
              (local_22a8,&local_2340,&local_2378,local_23c0,local_23f0,1);
    cfd::core::Privkey::~Privkey((Privkey *)0x29d758);
    std::__cxx11::string::~string(local_23e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_23e1);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x29d77f);
    std::__cxx11::string::~string(local_2398);
    std::allocator<char>::~allocator((allocator<char> *)&local_2399);
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x29d7a6);
    cfd::core::Txid::~Txid((Txid *)0x29d7b3);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
    ::operator++(&local_2308);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)this_02);
  iVar2 = cfd::core::ConfidentialTransaction::GetVsize();
  if (((iVar2 != 0x1018) &&
      (iVar2 = cfd::core::ConfidentialTransaction::GetVsize(), iVar2 != 0x1019)) &&
     (iVar2 = cfd::core::ConfidentialTransaction::GetVsize(), iVar2 != 0x101a)) {
    local_2404 = 100;
    local_2408 = cfd::core::ConfidentialTransaction::GetVsize();
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)lhs_expression,(char *)this_02,
               (int *)CONCAT44(in_stack_ffffffffffffd76c,uVar12),(uint *)this_01);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2400);
    if (!bVar1) {
      testing::Message::Message(&local_2410);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x29d9f3);
      testing::internal::AssertHelper::AssertHelper
                (&local_2418,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x633,pcVar7);
      testing::internal::AssertHelper::operator=(&local_2418,&local_2410);
      testing::internal::AssertHelper::~AssertHelper(&local_2418);
      testing::Message::~Message((Message *)0x29da50);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x29daa5);
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x29daed);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_01);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_02);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x29db62);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x29dba3);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x29dbb0);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)this_01);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x29ded7);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Check1) {
  // from cfd-go
  static const std::vector<TestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);

  try {
    ConfidentialTransactionContext tx("010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000");
    std::vector<cfd::UtxoData> utxos;
    utxos.resize(kFundCoinSelectElementsTestVector3.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{115800000}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{347180040}));
    map_target_value.emplace(exp_dummy_asset_c.GetHex(), Amount(int64_t{37654100}));
    Address addr = factory.GetAddress("ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h");
    Address addr1 = factory.GetAddress("ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    Address addr2 = factory.GetAddress("ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    Address addr3 = factory.GetAddress("ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_c.GetHex(), addr3.GetAddress());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        addr, key.DerivePubkey(90).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
        addr3, key.DerivePubkey(93).GetPubkey());
    std::vector<UtxoData> selected_utxos;
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    ElementsUtxoAndOption txin_utxo;
    txin_utxo.utxo.txid = Txid("9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff");
    txin_utxo.utxo.amount = Amount(int64_t{112340000});
    txin_utxo.utxo.asset = exp_dummy_asset_a;
    txin_utxo.utxo.descriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
    txin_utxo.utxo.address_type = AddressType::kP2shP2wpkhAddress;
    selected_txin_utxos.push_back(txin_utxo);
    selected_utxos.push_back(txin_utxo.utxo);
    double fee_rate = 0.15;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(0.15);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);

    EXPECT_EQ(kExpTxData, ctx.GetHex());
    EXPECT_EQ(618, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{3}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{3})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[2].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
      EXPECT_STREQ(addr3.GetAddress().c_str(), append_txout_addresses[1].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(ct_addr1);
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    ct_addrs.push_back(reserve_ct_addr3);
    context.CollectInputUtxo(selected_utxos);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5"));
    }
    if ((context.GetVsize() != 4120) && (context.GetVsize() != 4121) &&
        (context.GetVsize() != 4122)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}